

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

void settings::reset(void)

{
  long lVar1;
  allocator local_31f;
  allocator local_31e;
  allocator local_31d;
  allocator local_31c;
  allocator local_31b;
  allocator local_31a;
  allocator local_319;
  allocator local_318;
  allocator local_317;
  allocator local_316;
  allocator local_315;
  allocator local_314;
  allocator local_313;
  allocator local_312;
  allocator local_311;
  allocator local_310;
  allocator local_30f;
  allocator local_30e;
  allocator local_30d;
  allocator local_30c;
  allocator local_30b;
  allocator local_30a;
  allocator local_309;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)forbidden_function_abi_cxx11_,
              (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )ZEXT816(0));
  std::__cxx11::string::string(local_308,"prn",&local_31e);
  std::__cxx11::string::string(local_2e8,"print",&local_31f);
  std::__cxx11::string::string(local_2c8,"form",&local_31d);
  std::__cxx11::string::string(local_2a8,"fmt",&local_31a);
  std::__cxx11::string::string(local_288,"log",&local_31b);
  std::__cxx11::string::string(local_268,"debug",&local_31c);
  std::__cxx11::string::string(local_248,"dbg",&local_318);
  std::__cxx11::string::string(local_228,"assert",&local_319);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             format_function_name_abi_cxx11_,local_308,local_208);
  lVar1 = 0xe0;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"indexof",&local_31e);
  std::__cxx11::string::string(local_2e8,"findindex",&local_31f);
  std::__cxx11::string::string(local_2c8,"findvalue",&local_31d);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_can_return_null_abi_cxx11_,local_308,local_2a8);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"findvalue",&local_31e);
  std::__cxx11::string::string(local_2e8,"findindex",&local_31f);
  std::__cxx11::string::string(local_2c8,"__update",&local_31d);
  std::__cxx11::string::string(local_2a8,"filter",&local_31a);
  std::__cxx11::string::string(local_288,"map",&local_31b);
  std::__cxx11::string::string(local_268,"reduce",&local_31c);
  std::__cxx11::string::string(local_248,"each",&local_318);
  std::__cxx11::string::string(local_228,"sort",&local_319);
  std::__cxx11::string::string(local_208,"assert",&local_316);
  std::__cxx11::string::string(local_1e8,"persist",&local_317);
  std::__cxx11::string::string(local_1c8,"join",&local_315);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_calls_lambda_inplace_abi_cxx11_,local_308,local_1a8);
  lVar1 = 0x140;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"require",&local_31e);
  std::__cxx11::string::string(local_2e8,"require_optional",&local_31f);
  std::__cxx11::string::string(local_2c8,"vargv",&local_31d);
  std::__cxx11::string::string(local_2a8,"persist",&local_31a);
  std::__cxx11::string::string(local_288,"getclass",&local_31b);
  std::__cxx11::string::string(local_268,"keepref",&local_31c);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             std_identifier_abi_cxx11_,local_308,local_248);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"seterrorhandler",&local_31e);
  std::__cxx11::string::string(local_2e8,"setdebughook",&local_31f);
  std::__cxx11::string::string(local_2c8,"enabledebuginfo",&local_31d);
  std::__cxx11::string::string(local_2a8,"getstackinfos",&local_31a);
  std::__cxx11::string::string(local_288,"getroottable",&local_31b);
  std::__cxx11::string::string(local_268,"setroottable",&local_31c);
  std::__cxx11::string::string(local_248,"getconsttable",&local_318);
  std::__cxx11::string::string(local_228,"setconsttable",&local_319);
  std::__cxx11::string::string(local_208,"getclass",&local_316);
  std::__cxx11::string::string(local_1e8,"assert",&local_317);
  std::__cxx11::string::string(local_1c8,"print",&local_315);
  std::__cxx11::string::string(local_1a8,"error",&local_314);
  std::__cxx11::string::string(local_188,"compilestring",&local_312);
  std::__cxx11::string::string(local_168,"newthread",&local_313);
  std::__cxx11::string::string(local_148,"suspend",&local_309);
  std::__cxx11::string::string(local_128,"array",&local_30a);
  std::__cxx11::string::string(local_108,"type",&local_30b);
  std::__cxx11::string::string(local_e8,"callee",&local_30c);
  std::__cxx11::string::string(local_c8,"collectgarbage",&local_30d);
  std::__cxx11::string::string(local_a8,"resurrectunreachable",&local_30e);
  std::__cxx11::string::string(local_88,"min",&local_30f);
  std::__cxx11::string::string(local_68,"max",&local_310);
  std::__cxx11::string::string(local_48,"clamp",&local_311);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             std_function_abi_cxx11_,local_308,&stack0xffffffffffffffd8);
  lVar1 = 0x2c0;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"__merge",&local_31e);
  std::__cxx11::string::string(local_2e8,"indexof",&local_31f);
  std::__cxx11::string::string(local_2c8,"findindex",&local_31d);
  std::__cxx11::string::string(local_2a8,"findvalue",&local_31a);
  std::__cxx11::string::string(local_288,"len",&local_31b);
  std::__cxx11::string::string(local_268,"reduce",&local_31c);
  std::__cxx11::string::string(local_248,"tostring",&local_318);
  std::__cxx11::string::string(local_228,"tointeger",&local_319);
  std::__cxx11::string::string(local_208,"tofloat",&local_316);
  std::__cxx11::string::string(local_1e8,"slice",&local_317);
  std::__cxx11::string::string(local_1c8,"tolower",&local_315);
  std::__cxx11::string::string(local_1a8,"toupper",&local_314);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_result_must_be_utilized_abi_cxx11_,local_308,local_188);
  lVar1 = 0x160;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"subst",&local_31e);
  std::__cxx11::string::string(local_2e8,"concat",&local_31f);
  std::__cxx11::string::string(local_2c8,"tostring",&local_31d);
  std::__cxx11::string::string(local_2a8,"toupper",&local_31a);
  std::__cxx11::string::string(local_288,"tolower",&local_31b);
  std::__cxx11::string::string(local_268,"slice",&local_31c);
  std::__cxx11::string::string(local_248,"trim",&local_318);
  std::__cxx11::string::string(local_228,"join",&local_319);
  std::__cxx11::string::string(local_208,"format",&local_316);
  std::__cxx11::string::string(local_1e8,"replace",&local_317);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_can_return_string_abi_cxx11_,local_308,local_1c8);
  lVar1 = 0x120;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"has",&local_31e);
  std::__cxx11::string::string(local_2e8,"Has",&local_31f);
  std::__cxx11::string::string(local_2c8,"have",&local_31d);
  std::__cxx11::string::string(local_2a8,"Have",&local_31a);
  std::__cxx11::string::string(local_288,"should",&local_31b);
  std::__cxx11::string::string(local_268,"Should",&local_31c);
  std::__cxx11::string::string(local_248,"need",&local_318);
  std::__cxx11::string::string(local_228,"Need",&local_319);
  std::__cxx11::string::string(local_208,"is",&local_316);
  std::__cxx11::string::string(local_1e8,"Is",&local_317);
  std::__cxx11::string::string(local_1c8,"was",&local_315);
  std::__cxx11::string::string(local_1a8,"Was",&local_314);
  std::__cxx11::string::string(local_188,"will",&local_312);
  std::__cxx11::string::string(local_168,"Will",&local_313);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_should_return_bool_prefix_abi_cxx11_,local_308,local_148);
  lVar1 = 0x1a0;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"get",&local_31e);
  std::__cxx11::string::string(local_2e8,"Get",&local_31f);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_should_return_something_prefix_abi_cxx11_,local_308,local_2c8);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"require",&local_31e);
  std::__cxx11::string::string(local_2e8,"require_optional",&local_31f);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_forbidden_parent_dir_abi_cxx11_,local_308,local_2c8);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string(local_308,"extend",&local_31e);
  std::__cxx11::string::string(local_2e8,"append",&local_31f);
  std::__cxx11::string::string(local_2c8,"__update",&local_31d);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_modifies_object_abi_cxx11_,local_308,local_2a8);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string(local_308 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void reset()
  {
    forbidden_function = { };

    format_function_name =
    {
      "prn",
      "print",
      "form",
      "fmt",
      "log",
      "debug",
      "dbg",
      "assert",
    };

    function_can_return_null =
    {
      "indexof",
      "findindex",
      "findvalue",
    };

    function_calls_lambda_inplace =
    {
      "findvalue",
      "findindex",
      "__update",
      "filter",
      "map",
      "reduce",
      "each",
      "sort",
      "assert",
      "persist",
      "join",
    };

    std_identifier =
    {
      "require",
      "require_optional",
      "vargv",
      "persist",
      "getclass",
      "keepref",
    };

    std_function =
    {
      "seterrorhandler",
      "setdebughook",
      "enabledebuginfo",
      "getstackinfos",
      "getroottable",
      "setroottable",
      "getconsttable",
      "setconsttable",
      "getclass",
      "assert",
      "print",
      "error",
      "compilestring",
      "newthread",
      "suspend",
      "array",
      "type",
      "callee",
      "collectgarbage",
      "resurrectunreachable",
      "min",
      "max",
      "clamp",
    };

    function_result_must_be_utilized =
    {
      "__merge",
      "indexof",
      "findindex",
      "findvalue",
      "len",
      "reduce",
      "tostring",
      "tointeger",
      "tofloat",
      "slice",
      "tolower",
      "toupper",
    };

    function_can_return_string =
    {
      "subst",
      "concat",
      "tostring",
      "toupper",
      "tolower",
      "slice",
      "trim",
      "join",
      "format",
      "replace",
    };

    function_should_return_bool_prefix =
    {
      "has",
      "Has",
      "have",
      "Have",
      "should",
      "Should",
      "need",
      "Need",
      "is",
      "Is",
      "was",
      "Was",
      "will",
      "Will",
    };

    function_should_return_something_prefix =
    {
      "get",
      "Get",
    };

    function_forbidden_parent_dir =
    {
      "require",
      "require_optional",
    };

    function_modifies_object =
    {
      "extend",
      "append",
      "__update",
    };
  }